

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaGetCanonValueWhtsp
              (xmlSchemaValPtr val,xmlChar **retValue,xmlSchemaWhitespaceValueType ws)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlSchemaWhitespaceValueType ws_local;
  xmlChar **retValue_local;
  xmlSchemaValPtr val_local;
  
  if ((retValue == (xmlChar **)0x0) || (val == (xmlSchemaValPtr)0x0)) {
    val_local._4_4_ = -1;
  }
  else if ((ws == XML_SCHEMA_WHITESPACE_UNKNOWN) || (XML_SCHEMA_WHITESPACE_COLLAPSE < ws)) {
    val_local._4_4_ = -1;
  }
  else {
    *retValue = (xmlChar *)0x0;
    if (val->type == XML_SCHEMAS_STRING) {
      if ((val->value).decimal.str == (xmlChar *)0x0) {
        pxVar2 = xmlStrdup("");
        *retValue = pxVar2;
      }
      else if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
        pxVar2 = xmlSchemaCollapseString((val->value).decimal.str);
        *retValue = pxVar2;
      }
      else if (ws == XML_SCHEMA_WHITESPACE_REPLACE) {
        pxVar2 = xmlSchemaWhiteSpaceReplace((val->value).decimal.str);
        *retValue = pxVar2;
      }
      if (*retValue == (xmlChar *)0x0) {
        pxVar2 = xmlStrdup((val->value).decimal.str);
        *retValue = pxVar2;
      }
    }
    else {
      if (val->type != XML_SCHEMAS_NORMSTRING) {
        iVar1 = xmlSchemaGetCanonValue(val,retValue);
        return iVar1;
      }
      if ((val->value).decimal.str == (xmlChar *)0x0) {
        pxVar2 = xmlStrdup("");
        *retValue = pxVar2;
      }
      else {
        if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
          pxVar2 = xmlSchemaCollapseString((val->value).decimal.str);
          *retValue = pxVar2;
        }
        else {
          pxVar2 = xmlSchemaWhiteSpaceReplace((val->value).decimal.str);
          *retValue = pxVar2;
        }
        if (*retValue == (xmlChar *)0x0) {
          pxVar2 = xmlStrdup((val->value).decimal.str);
          *retValue = pxVar2;
        }
      }
    }
    val_local._4_4_ = 0;
  }
  return val_local._4_4_;
}

Assistant:

int
xmlSchemaGetCanonValueWhtsp(xmlSchemaValPtr val,
			    const xmlChar **retValue,
			    xmlSchemaWhitespaceValueType ws)
{
    if ((retValue == NULL) || (val == NULL))
	return (-1);
    if ((ws == XML_SCHEMA_WHITESPACE_UNKNOWN) ||
	(ws > XML_SCHEMA_WHITESPACE_COLLAPSE))
	return (-1);

    *retValue = NULL;
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
		*retValue = xmlSchemaCollapseString(val->value.str);
	    else if (ws == XML_SCHEMA_WHITESPACE_REPLACE)
		*retValue = xmlSchemaWhiteSpaceReplace(val->value.str);
	    if ((*retValue) == NULL)
		*retValue = BAD_CAST xmlStrdup(val->value.str);
	    break;
	case XML_SCHEMAS_NORMSTRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else {
		if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
		    *retValue = xmlSchemaCollapseString(val->value.str);
		else
		    *retValue = xmlSchemaWhiteSpaceReplace(val->value.str);
		if ((*retValue) == NULL)
		    *retValue = BAD_CAST xmlStrdup(val->value.str);
	    }
	    break;
	default:
	    return (xmlSchemaGetCanonValue(val, retValue));
    }
    return (0);
}